

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_schnorrsig.cpp
# Opt level: O0

void __thiscall
SchnorrPubkey_TweakAddFromPrivkey_Test::TestBody(SchnorrPubkey_TweakAddFromPrivkey_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_230;
  Message local_228;
  string local_220;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_3;
  Privkey local_1d0;
  undefined1 local_1b0 [8];
  Privkey key;
  Message local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_2;
  Message local_168;
  string local_160;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_1;
  Message local_128;
  string local_120;
  undefined1 local_100 [8];
  AssertionResult gtest_ar;
  undefined1 local_e8 [8];
  string exp_privkey1;
  undefined1 local_c0 [8];
  string exp_pubkey1;
  SchnorrPubkey actual_pubkey;
  undefined1 local_80 [7];
  bool parity;
  Privkey tweaked_sk;
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  ByteData256 tweak1;
  SchnorrPubkey_TweakAddFromPrivkey_Test *this_local;
  
  tweak1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,"45cfe14923541d2908a64f32aaf09b703dbd2cfb256830b0eebc5573b15a4476",
             &local_49);
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  cfd::core::Privkey::Privkey((Privkey *)local_80);
  actual_pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  cfd::core::SchnorrPubkey::CreateTweakAddFromPrivkey
            ((SchnorrPubkey *)((long)&exp_pubkey1.field_2 + 8),&::sk,(ByteData256 *)local_28,
             (Privkey *)local_80,
             (bool *)((long)&actual_pubkey.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_c0,"ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440",
             (allocator *)(exp_privkey1.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(exp_privkey1.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_e8,"dd43698cf5f96d33bf895c28d67b5ffbd736c2d4cef91e1f8ce0e38c31a709c8",
             (allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_
            (&local_120,(SchnorrPubkey *)((long)&exp_pubkey1.field_2 + 8));
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_100,"exp_pubkey1","actual_pubkey.GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
             &local_120);
  std::__cxx11::string::~string((string *)&local_120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x99,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_160,(Privkey *)local_80);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_140,"exp_privkey1","tweaked_sk.GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
             &local_160);
  std::__cxx11::string::~string((string *)&local_160);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x9a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((EqHelper<false> *)local_180,"pubkey_parity","parity",&pubkey_parity,
             (bool *)((long)&actual_pubkey.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&key.is_compressed_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x9b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&key.is_compressed_,&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&key.is_compressed_);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  cfd::core::Privkey::Privkey((Privkey *)local_1b0,&::sk);
  if ((actual_pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
    cfd::core::Privkey::CreateNegate(&local_1d0,(Privkey *)local_1b0);
    cfd::core::Privkey::operator=((Privkey *)local_1b0,&local_1d0);
    cfd::core::Privkey::~Privkey(&local_1d0);
  }
  cfd::core::Privkey::CreateTweakAdd
            ((Privkey *)&gtest_ar_3.message_,(Privkey *)local_1b0,(ByteData256 *)local_28);
  cfd::core::Privkey::operator=((Privkey *)local_1b0,(Privkey *)&gtest_ar_3.message_);
  cfd::core::Privkey::~Privkey((Privkey *)&gtest_ar_3.message_);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_220,(Privkey *)local_1b0);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_200,"exp_privkey1","key.GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
             &local_220);
  std::__cxx11::string::~string((string *)&local_220);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar1) {
    testing::Message::Message(&local_228);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xa0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_230,&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    testing::Message::~Message(&local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  cfd::core::Privkey::~Privkey((Privkey *)local_1b0);
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string((string *)local_c0);
  cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)((long)&exp_pubkey1.field_2 + 8));
  cfd::core::Privkey::~Privkey((Privkey *)local_80);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_28);
  return;
}

Assistant:

TEST(SchnorrPubkey, TweakAddFromPrivkey) {
  ByteData256 tweak1("45cfe14923541d2908a64f32aaf09b703dbd2cfb256830b0eebc5573b15a4476");
  Privkey tweaked_sk;
  bool parity = false;
  auto actual_pubkey = SchnorrPubkey::CreateTweakAddFromPrivkey(
      sk, tweak1, &tweaked_sk, &parity);

  std::string exp_pubkey1 = "ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440";
  std::string exp_privkey1 = "dd43698cf5f96d33bf895c28d67b5ffbd736c2d4cef91e1f8ce0e38c31a709c8";

  EXPECT_EQ(exp_pubkey1, actual_pubkey.GetHex());
  EXPECT_EQ(exp_privkey1, tweaked_sk.GetHex());
  EXPECT_EQ(pubkey_parity, parity);

  Privkey key = sk;
  if (parity) key = key.CreateNegate();
  key = key.CreateTweakAdd(tweak1);
  EXPECT_EQ(exp_privkey1, key.GetHex());
}